

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O0

FILE * output_file_open(char *zFile,int bTextMode)

{
  int iVar1;
  int in_ESI;
  char *__modes;
  char *in_RDI;
  FILE *f;
  FILE *local_18;
  
  iVar1 = strcmp(in_RDI,"stdout");
  if (iVar1 == 0) {
    local_18 = _stdout;
  }
  else {
    iVar1 = strcmp(in_RDI,"stderr");
    if (iVar1 == 0) {
      local_18 = _stderr;
    }
    else {
      iVar1 = strcmp(in_RDI,"off");
      if (iVar1 == 0) {
        local_18 = (FILE *)0x0;
      }
      else {
        __modes = "wb";
        if (in_ESI != 0) {
          __modes = "w";
        }
        local_18 = fopen64(in_RDI,__modes);
        if (local_18 == (FILE *)0x0) {
          fprintf(_stderr,"Error: cannot open \"%s\"\n",in_RDI);
        }
      }
    }
  }
  return (FILE *)local_18;
}

Assistant:

static FILE *output_file_open(const char *zFile, int bTextMode) {
	FILE *f;
	if (strcmp(zFile, "stdout") == 0) {
		f = stdout;
	} else if (strcmp(zFile, "stderr") == 0) {
		f = stderr;
	} else if (strcmp(zFile, "off") == 0) {
		f = 0;
	} else {
		f = fopen(zFile, bTextMode ? "w" : "wb");
		if (f == 0) {
			utf8_printf(stderr, "Error: cannot open \"%s\"\n", zFile);
		}
	}
	return f;
}